

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::OcclusionQueryCase::iterate(OcclusionQueryCase *this)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *context;
  bool bVar3;
  pointer pOVar4;
  pointer pOVar5;
  GLuint *ids;
  deRandom *pdVar6;
  undefined4 uVar7;
  GLint location;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  GLenum GVar12;
  RenderTarget *pRVar13;
  TestError *this_00;
  uint *rnd;
  Random *pRVar14;
  Surface *surface;
  void *__buf;
  uint uVar15;
  int iVar16;
  IterateResult IVar17;
  uint uVar18;
  int iVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  char *pcVar27;
  bool bVar28;
  float minZ;
  float in_XMM4_Da;
  Surface pixels;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  deUint32 resultAvailable;
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  local_2c8;
  GLuint *local_2b0;
  deRandom *local_2a8;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  ulong local_290;
  ulong local_288;
  Surface local_280;
  vector<float,_std::allocator<float>_> local_268;
  vector<float,_std::allocator<float>_> local_248;
  string local_230;
  RenderTarget *local_210;
  string local_208;
  undefined1 local_1e8 [32];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [4];
  ios_base local_170 [264];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  location = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2b0 = (GLuint *)operator_new(4);
  *local_2b0 = 0;
  local_288 = (ulong)(uint)pRVar13->m_width;
  local_290 = (ulong)(uint)pRVar13->m_height;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_210 = pRVar13;
  local_1e8._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Case iteration ",0xf);
  std::ostream::operator<<(poVar1,this->m_iterNdx + 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Parameters:\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"- ",2);
  std::ostream::operator<<(poVar1,this->m_numOccluderDraws);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," occluder draws, ",0x11);
  std::ostream::operator<<(poVar1,this->m_numOccludersPerDraw);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," primitive writes per draw,\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"- ",2);
  std::ostream::operator<<(poVar1,this->m_numTargetDraws);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," target draws, ",0xf);
  std::ostream::operator<<(poVar1,this->m_numTargetsPerDraw);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," targets per draw\n",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  minZ = 1.0;
  glwClearColor(0.0,0.0,0.0,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnableVertexAttribArray(0);
  local_2c8.
  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ._M_impl.super__Vector_impl_data._M_start = (OccluderType *)0x0;
  local_2c8.
  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (OccluderType *)0x0;
  local_2c8.
  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (OccluderType *)0x0;
  if ((this->m_occluderTypes & 2) != 0) {
    local_1e8._0_4_ = I;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
              (&local_2c8,(iterator)0x0,(OccluderType *)local_1e8);
  }
  if ((this->m_occluderTypes & 4) != 0) {
    local_1e8._0_4_ = LA;
    if (local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
                (&local_2c8,
                 (iterator)
                 local_2c8.
                 super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(OccluderType *)local_1e8);
    }
    else {
      *local_2c8.
       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
       ._M_impl.super__Vector_impl_data._M_finish = OCCLUDER_DEPTH_CLEAR;
      local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((this->m_occluderTypes & 8) != 0) {
    local_1e8._0_4_ = RGBA;
    if (local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
                (&local_2c8,
                 (iterator)
                 local_2c8.
                 super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(OccluderType *)local_1e8);
    }
    else {
      *local_2c8.
       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
       ._M_impl.super__Vector_impl_data._M_finish = OCCLUDER_STENCIL_WRITE;
      local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((this->m_occluderTypes & 0x10) != 0) {
    local_1e8._0_4_ = sBGR;
    if (local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
                (&local_2c8,
                 (iterator)
                 local_2c8.
                 super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(OccluderType *)local_1e8);
    }
    else {
      *local_2c8.
       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
       ._M_impl.super__Vector_impl_data._M_finish = OCCLUDER_STENCIL_CLEAR;
      local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (0 < this->m_numOccluderDraws) {
    local_2a8 = &(this->m_rnd).m_rnd;
    local_294 = (int)local_288 + 0x65;
    local_298 = (int)local_290 + 0x65;
    local_29c = (int)local_288 + 1;
    local_2a0 = (int)local_290 + 1;
    iVar16 = 1;
    do {
      pOVar5 = local_2c8.
               super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pOVar4 = local_2c8.
               super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_2c8.
          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_2c8.
          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      dVar8 = deRandom_getUint32(local_2a8);
      pdVar6 = local_2a8;
      rnd = &switchD_005714fc::switchdataD_00b19e8c;
      switch(local_2c8.
             super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)dVar8 % ((ulong)((long)pOVar5 - (long)pOVar4) >> 2 & 0xffffffff))] -
             OCCLUDER_DEPTH_WRITE >> 1 |
             (uint)((local_2c8.
                     super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)dVar8 % ((ulong)((long)pOVar5 - (long)pOVar4) >> 2 & 0xffffffff))
                     ] - OCCLUDER_DEPTH_WRITE & 1) != 0) << 0x1f) {
      case 0:
        poVar1 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Occluder draw ",0xe);
        pdVar6 = local_2a8;
        std::ostream::operator<<(poVar1,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
        std::ostream::operator<<(poVar1,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Depth write",0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        local_48._0_4_ = pdVar6->x;
        local_48._4_4_ = pdVar6->y;
        uStack_40._0_4_ = pdVar6->z;
        uStack_40._4_4_ = pdVar6->w;
        generateVertices(&local_248,this->m_occluderSize,0.0,this->m_numOccludersPerDraw,
                         (int)&local_48,(Random *)rnd,0.6,minZ,in_XMM4_Da);
        glwEnable(0xb71);
        minZ = 1.0;
        glwUniform4f(location,0.0,0.0,1.0,1.0);
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        GVar12 = 0xb71;
        glwDrawArrays(4,0,this->m_numOccludersPerDraw * 3);
        goto LAB_005717c5;
      case OCCLUDER_SCISSOR:
        dVar8 = deRandom_getUint32(local_2a8);
        uVar18 = dVar8 % local_294;
        dVar8 = deRandom_getUint32(pdVar6);
        uVar15 = dVar8 % local_298;
        dVar8 = deRandom_getUint32(pdVar6);
        uVar25 = dVar8 % local_29c;
        dVar8 = deRandom_getUint32(pdVar6);
        uVar22 = dVar8 % local_2a0;
        poVar1 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Occluder draw ",0xe);
        std::ostream::operator<<(poVar1,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
        std::ostream::operator<<(poVar1,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Depth clear",0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        poVar1 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Depth-clearing box drawn at ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
        iVar24 = uVar18 - 100;
        std::ostream::operator<<(poVar1,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        iVar19 = uVar15 - 100;
        std::ostream::operator<<(poVar1,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", width = ",10);
        iVar26 = uVar25 + 100;
        std::ostream::operator<<(poVar1,iVar26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", height = ",0xb);
        iVar23 = uVar22 + 100;
        std::ostream::operator<<(poVar1,iVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        glwEnable(0xc11);
        glwScissor(iVar24,iVar19,iVar26,iVar23);
        glwClearDepthf(0.0);
        minZ = 1.0;
        glwClearColor(0.0,0.5,0.8,1.0);
        glwClear(0x4100);
        glwDisable(0xc11);
        break;
      case OCCLUDER_DEPTH_WRITE|OCCLUDER_SCISSOR:
        poVar1 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Occluder draw ",0xe);
        pdVar6 = local_2a8;
        std::ostream::operator<<(poVar1,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
        std::ostream::operator<<(poVar1,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Stencil write",0xd);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        local_58._0_4_ = pdVar6->x;
        local_58._4_4_ = pdVar6->y;
        uStack_50._0_4_ = pdVar6->z;
        uStack_50._4_4_ = pdVar6->w;
        generateVertices(&local_248,this->m_occluderSize,0.0,this->m_numOccludersPerDraw,
                         (int)&local_58,(Random *)rnd,0.6,minZ,in_XMM4_Da);
        glwStencilFunc(0x207,1,0xff);
        glwStencilOp(0x1e00,0x1e00,0x1e01);
        glwEnable(0xb90);
        minZ = 1.0;
        glwUniform4f(location,0.0,1.0,0.0,1.0);
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        GVar12 = 0xb90;
        glwDrawArrays(4,0,this->m_numOccludersPerDraw * 3);
LAB_005717c5:
        glwDisable(GVar12);
        break;
      case OCCLUDER_DEPTH_CLEAR|OCCLUDER_DEPTH_WRITE|OCCLUDER_SCISSOR:
        dVar8 = deRandom_getUint32(local_2a8);
        uVar18 = dVar8 % local_294;
        dVar8 = deRandom_getUint32(pdVar6);
        uVar15 = dVar8 % local_298;
        dVar8 = deRandom_getUint32(pdVar6);
        uVar25 = dVar8 % local_29c;
        dVar8 = deRandom_getUint32(pdVar6);
        uVar22 = dVar8 % local_2a0;
        poVar1 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Occluder draw ",0xe);
        std::ostream::operator<<(poVar1,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
        std::ostream::operator<<(poVar1,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Stencil clear",0xd);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        poVar1 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Stencil-clearing box drawn at ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
        iVar24 = uVar18 - 100;
        std::ostream::operator<<(poVar1,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        iVar19 = uVar15 - 100;
        std::ostream::operator<<(poVar1,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", width = ",10);
        iVar26 = uVar25 + 100;
        std::ostream::operator<<(poVar1,iVar26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", height = ",0xb);
        iVar23 = uVar22 + 100;
        std::ostream::operator<<(poVar1,iVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        glwEnable(0xc11);
        glwScissor(iVar24,iVar19,iVar26,iVar23);
        glwClearStencil(1);
        minZ = 1.0;
        glwClearColor(0.0,0.8,0.5,1.0);
        glwClear(0x4400);
        glwDisable(0xc11);
      }
      bVar28 = iVar16 < this->m_numOccluderDraws;
      iVar16 = iVar16 + 1;
    } while (bVar28);
  }
  if ((this->m_occluderTypes & 1) != 0) {
    pRVar14 = &this->m_rnd;
    dVar8 = deRandom_getUint32(&pRVar14->m_rnd);
    iVar16 = (int)local_288;
    dVar9 = deRandom_getUint32(&pRVar14->m_rnd);
    iVar19 = (int)local_290;
    dVar10 = deRandom_getUint32(&pRVar14->m_rnd);
    iVar24 = (int)local_288;
    dVar11 = deRandom_getUint32(&pRVar14->m_rnd);
    iVar23 = (int)local_290;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Scissor box drawn at ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    iVar16 = dVar8 % (iVar16 + 1U) - 100;
    std::ostream::operator<<(poVar1,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    iVar19 = dVar9 % (iVar19 + 1U) - 100;
    std::ostream::operator<<(poVar1,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", width = ",10);
    iVar26 = dVar10 % (iVar24 - 0x95U) + 0xfa;
    std::ostream::operator<<(poVar1,iVar26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", height = ",0xb);
    iVar24 = dVar11 % (iVar23 - 0x95U) + 0xfa;
    std::ostream::operator<<(poVar1,iVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    glwEnable(0xc11);
    glwScissor(iVar16,iVar19,iVar26,iVar24);
  }
  glwGenQueries(1,local_2b0);
  glwBeginQuery(this->m_queryMode,*local_2b0);
  GVar12 = glwGetError();
  pRVar14 = (Random *)0x154;
  glu::checkError(GVar12,"Occlusion query started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x154);
  glwEnable(0xb71);
  glwEnable(0xb90);
  glwStencilFunc(0x202,0,0xff);
  if (0 < this->m_numTargetDraws) {
    iVar16 = 0;
    do {
      local_68._0_4_ = (this->m_rnd).m_rnd.x;
      local_68._4_4_ = (this->m_rnd).m_rnd.y;
      uStack_60._0_4_ = (this->m_rnd).m_rnd.z;
      uStack_60._4_4_ = (this->m_rnd).m_rnd.w;
      generateVertices(&local_268,this->m_targetSize,0.4,this->m_numTargetsPerDraw,(int)&local_68,
                       pRVar14,1.0,minZ,in_XMM4_Da);
      if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        minZ = 1.0;
        glwUniform4f(location,1.0,0.0,0.0,1.0);
        pRVar14 = (Random *)0x0;
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        glwDrawArrays(4,0,this->m_numTargetsPerDraw * 3);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < this->m_numTargetDraws);
  }
  glwEndQuery(this->m_queryMode);
  glwFinish();
  glwDisable(0xc11);
  glwDisable(0xb90);
  glwDisable(0xb71);
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  glwGetQueryObjectuiv(*local_2b0,0x8867,(GLuint *)local_1e8);
  ids = local_2b0;
  if (local_1e8._0_4_ == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Occlusion query failed to return a result after glFinish()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
               ,0x174);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  glwGetQueryObjectuiv(*local_2b0,0x8866,(GLuint *)local_1e8);
  uVar7 = local_1e8._0_4_;
  bVar28 = local_1e8._0_4_ != 0;
  glwDeleteQueries(1,ids);
  GVar12 = glwGetError();
  glu::checkError(GVar12,"Occlusion query finished",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x17f);
  tcu::Surface::Surface(&local_280,local_210->m_width,local_210->m_height);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_230._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_280.m_pixels.m_cap != (void *)0x0) {
    local_280.m_pixels.m_cap = (size_t)local_280.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1e8,(TextureFormat *)&local_230,local_280.m_width,
             local_280.m_height,1,(void *)local_280.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1e8);
  iVar16 = 0;
  if (local_280.m_height < 1) {
    bVar3 = false;
  }
  else {
    iVar19 = 0;
    bVar3 = false;
    do {
      uVar21 = (ulong)(uint)local_280.m_width;
      iVar24 = iVar16;
      if (0 < local_280.m_width) {
        do {
          if (*(char *)((long)local_280.m_pixels.m_ptr + (long)iVar24 * 4) != '\0') {
            bVar3 = true;
            break;
          }
          iVar24 = iVar24 + 1;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      if (bVar3) break;
      iVar19 = iVar19 + 1;
      iVar16 = iVar16 + local_280.m_width;
    } while (iVar19 != local_280.m_height);
  }
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Occlusion query result:  Target ",0x20);
  pcVar27 = "invisible";
  pcVar20 = "invisible";
  if (uVar7 != 0) {
    pcVar20 = "visible";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar20,(ulong)(uVar7 == 0) * 2 + 7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Framebuffer read result: Target ",0x20);
  if (bVar3) {
    pcVar27 = "visible";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar27,(ulong)(byte)~bVar3 * 2 + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  if (this->m_queryMode == 0x8d6a) {
    if (uVar7 != 0 || bVar3) goto LAB_00572210;
  }
  else {
    bVar28 = (bool)(uVar7 != 0 ^ bVar3 ^ 1);
LAB_00572210:
    if (bVar28 == false) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Result image","");
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Result image","");
      surface = &local_280;
      tcu::LogImage::LogImage
                ((LogImage *)local_1e8,&local_230,&local_208,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_1e8,TVar2.order,__buf,(size_t)surface);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
      }
      if (local_1e8._0_8_ != (long)local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      poVar1 = (ostringstream *)(local_1e8 + 8);
      local_1e8._0_8_ = TVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Case FAILED!",0xc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      IVar17 = STOP;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
      goto LAB_00572404;
    }
  }
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Case passed!",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  iVar16 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar16;
  IVar17 = (IterateResult)(iVar16 < 10);
LAB_00572404:
  tcu::Surface::~Surface(&local_280);
  if (local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_start != (OccluderType *)0x0) {
    operator_delete(local_2c8.
                    super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_2b0,4);
  if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar17;
}

Assistant:

OcclusionQueryCase::IterateResult OcclusionQueryCase::iterate (void)
{
	tcu::TestLog&				log					= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderTarget();
	deUint32					colorUnif			= glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds(1, 0);
	bool						queryResult			= false;
	bool						colorReadResult		= false;
	int							targetW				= renderTarget.getWidth();
	int							targetH				= renderTarget.getHeight();

	log << tcu::TestLog::Message << "Case iteration " << m_iterNdx+1 << " / " << NUM_CASE_ITERATIONS << tcu::TestLog::EndMessage;
	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- " << m_numOccluderDraws	<< " occluder draws, "	<< m_numOccludersPerDraw	<< " primitive writes per draw,\n"
								 << "- " << m_numTargetDraws	<< " target draws, "	<< m_numTargetsPerDraw		<< " targets per draw\n"
		<< tcu::TestLog::EndMessage;

	DE_ASSERT(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClearStencil				(0);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	// Draw occluders

	std::vector<OccluderType> occOptions(0);
	if (m_occluderTypes & OCCLUDER_DEPTH_WRITE)		occOptions.push_back(OCCLUDER_DEPTH_WRITE);
	if (m_occluderTypes & OCCLUDER_DEPTH_CLEAR)		occOptions.push_back(OCCLUDER_DEPTH_CLEAR);
	if (m_occluderTypes & OCCLUDER_STENCIL_WRITE)	occOptions.push_back(OCCLUDER_STENCIL_WRITE);
	if (m_occluderTypes & OCCLUDER_STENCIL_CLEAR)	occOptions.push_back(OCCLUDER_STENCIL_CLEAR);

	for (int i = 0; i < m_numOccluderDraws; i++)
	{
		if (occOptions.empty())
			break;

		OccluderType type = occOptions[m_rnd.getInt(0, (int)occOptions.size()-1)];	// Choosing a random occluder type from available options

		switch (type)
		{
			case OCCLUDER_DEPTH_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Depth write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);	// Generate vertices for occluding primitives

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_DEPTH_TEST);
				glUniform4f				(colorUnif, DEPTH_WRITE_COLOR.x(), DEPTH_WRITE_COLOR.y(), DEPTH_WRITE_COLOR.z(), DEPTH_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_DEPTH_TEST);

				break;

			case OCCLUDER_DEPTH_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetW+DEPTH_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetH+DEPTH_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Depth clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Depth-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearDepthf	(0.0f);
				glClearColor	(DEPTH_CLEAR_COLOR.x(), DEPTH_CLEAR_COLOR.y(), DEPTH_CLEAR_COLOR.z(), DEPTH_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			case OCCLUDER_STENCIL_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Stencil write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);

				glStencilFunc	(GL_ALWAYS, 1, 0xFF);
				glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_STENCIL_TEST);
				glUniform4f				(colorUnif, STENCIL_WRITE_COLOR.x(), STENCIL_WRITE_COLOR.y(), STENCIL_WRITE_COLOR.z(), STENCIL_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_STENCIL_TEST);

				break;

			case OCCLUDER_STENCIL_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetW+STENCIL_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetH+STENCIL_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Stencil clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Stencil-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearStencil	(1);
				glClearColor	(STENCIL_CLEAR_COLOR.x(), STENCIL_CLEAR_COLOR.y(), STENCIL_CLEAR_COLOR.z(), STENCIL_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	if (m_occluderTypes & OCCLUDER_SCISSOR)
	{
		int scissorBoxX = m_rnd.getInt(-SCISSOR_OFFSET,	targetW-SCISSOR_OFFSET);
		int scissorBoxY = m_rnd.getInt(-SCISSOR_OFFSET,	targetH-SCISSOR_OFFSET);
		int scissorBoxW = m_rnd.getInt(SCISSOR_MINSIZE,	targetW+SCISSOR_OFFSET);
		int scissorBoxH = m_rnd.getInt(SCISSOR_MINSIZE,	targetH+SCISSOR_OFFSET);

		log << tcu::TestLog::Message	<< "Scissor box drawn at "
										<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
										<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
			<< tcu::TestLog::EndMessage;

		glEnable	(GL_SCISSOR_TEST);
		glScissor	(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
	}

	glGenQueries	(1, &queryIds[0]);
	glBeginQuery	(m_queryMode, queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query started");

	// Draw target primitives

	glEnable		(GL_DEPTH_TEST);
	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_EQUAL, 0, 0xFF);

	for (int i = 0; i < m_numTargetDraws; i++)
	{
		generateVertices(targetVertices, 2.0f, 2.0f, m_numTargetsPerDraw, 3,  m_rnd, m_targetSize, 0.4f, 1.0f);		// Generate vertices for target primitives

		if (!targetVertices.empty())
		{
			glUniform4f				(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());
			glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &targetVertices[0]);
			glDrawArrays			(GL_TRIANGLES, 0, 3*m_numTargetsPerDraw);
		}
	}

	glEndQuery		(m_queryMode);
	glFinish		();
	glDisable		(GL_SCISSOR_TEST);
	glDisable		(GL_STENCIL_TEST);
	glDisable		(GL_DEPTH_TEST);

	// Check that query result is available.
	{
		deUint32 resultAvailable = GL_FALSE;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT_AVAILABLE, &resultAvailable);

		if (resultAvailable == GL_FALSE)
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");
	}

	// Read query result.
	{
		deUint32 result = 0;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT, &result);
		queryResult = (result != GL_FALSE);
	}

	glDeleteQueries	(1, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query finished");

	// Read pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getRed() != 0)
				{
					colorReadResult = true;
					break;
				}
			}
			if (colorReadResult) break;
		}
	}

	log << tcu::TestLog::Message << "Occlusion query result:  Target " << (queryResult		? "visible" : "invisible") << "\n"
								 << "Framebuffer read result: Target " << (colorReadResult	? "visible" : "invisible") << tcu::TestLog::EndMessage;

	bool testOk = false;
	if (m_queryMode == GL_ANY_SAMPLES_PASSED_CONSERVATIVE)
	{
		if (queryResult || colorReadResult)
			testOk = queryResult;	// Allow conservative occlusion query to return false positives.
		else
			testOk = queryResult == colorReadResult;
	}
	else
		testOk = (queryResult == colorReadResult);

	if (!testOk)
	{
		log << tcu::TestLog::Image("Result image", "Result image", pixels);
		log << tcu::TestLog::Message << "Case FAILED!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}